

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_> *
__thiscall Assimp::FBX::Document::AnimationStacks(Document *this)

{
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *this_00;
  pointer *pppAVar1;
  pointer puVar2;
  pointer puVar3;
  uint64_t *puVar4;
  iterator __position;
  LazyObject *this_01;
  uint64_t *puVar5;
  AnimationStack *stack;
  AnimationStack *local_58;
  string local_50;
  
  this_00 = &this->animationStacksResolved;
  if ((this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      std::
      vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ::reserve(this_00,(long)puVar3 - (long)puVar2 >> 3);
      puVar5 = (this->animationStacks).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->animationStacks).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar5 != puVar4) {
        do {
          this_01 = GetObject(this,*puVar5);
          if ((this_01 == (LazyObject *)0x0) ||
             (local_58 = LazyObject::Get<Assimp::FBX::AnimationStack>(this_01,false),
             local_58 == (AnimationStack *)0x0)) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"failed to read AnimationStack object","");
            Util::DOMWarning(&local_50,(Element *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            __position._M_current =
                 (this->animationStacksResolved).
                 super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->animationStacksResolved).
                super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Assimp::FBX::AnimationStack_const*,std::allocator<Assimp::FBX::AnimationStack_const*>>
              ::_M_realloc_insert<Assimp::FBX::AnimationStack_const*const&>
                        ((vector<Assimp::FBX::AnimationStack_const*,std::allocator<Assimp::FBX::AnimationStack_const*>>
                          *)this_00,__position,&local_58);
            }
            else {
              *__position._M_current = local_58;
              pppAVar1 = &(this->animationStacksResolved).
                          super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppAVar1 = *pppAVar1 + 1;
            }
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar4);
      }
    }
  }
  return this_00;
}

Assistant:

const std::vector<const AnimationStack*>& Document::AnimationStacks() const
{
    if (!animationStacksResolved.empty() || animationStacks.empty()) {
        return animationStacksResolved;
    }

    animationStacksResolved.reserve(animationStacks.size());
    for(uint64_t id : animationStacks) {
        LazyObject* const lazy = GetObject(id);
        const AnimationStack* stack;
        if(!lazy || !(stack = lazy->Get<AnimationStack>())) {
            DOMWarning("failed to read AnimationStack object");
            continue;
        }
        animationStacksResolved.push_back(stack);
    }

    return animationStacksResolved;
}